

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int lookforfunc(lua_State *L,char *path,char *sym)

{
  void *plib;
  lua_CFunction fn;
  int iVar1;
  
  plib = checkclib(L,path);
  if (plib == (void *)0x0) {
    plib = lsys_load(L,path,(uint)(*sym == '*'));
    if (plib == (void *)0x0) {
      return 1;
    }
    addtoclib(L,path,plib);
  }
  if (*sym == '*') {
    lua_pushboolean(L,1);
    iVar1 = 0;
  }
  else {
    fn = lsys_sym(L,plib,sym);
    if (fn == (lua_CFunction)0x0) {
      iVar1 = 2;
    }
    else {
      iVar1 = 0;
      lua_pushcclosure(L,fn,0);
    }
  }
  return iVar1;
}

Assistant:

static int lookforfunc (lua_State *L, const char *path, const char *sym) {
  void *reg = checkclib(L, path);  /* check loaded C libraries */
  if (reg == NULL) {  /* must load library? */
    reg = lsys_load(L, path, *sym == '*');  /* global symbols if 'sym'=='*' */
    if (reg == NULL) return ERRLIB;  /* unable to load library */
    addtoclib(L, path, reg);
  }
  if (*sym == '*') {  /* loading only library (no function)? */
    lua_pushboolean(L, 1);  /* return 'true' */
    return 0;  /* no errors */
  }
  else {
    lua_CFunction f = lsys_sym(L, reg, sym);
    if (f == NULL)
      return ERRFUNC;  /* unable to find function */
    lua_pushcfunction(L, f);  /* else create new function */
    return 0;  /* no errors */
  }
}